

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall SQVM::TypeOf(SQVM *this,SQObjectPtr *obj1,SQObjectPtr *dest)

{
  SQTable *pSVar1;
  SQSharedState *ss;
  int iVar2;
  SQChar *s;
  SQString *x;
  SQMetaMethod mm;
  byte unaff_R12B;
  SQObjectPtr closure;
  
  if ((((obj1->super_SQObject)._type & 0x2000000) != 0) &&
     (pSVar1 = (obj1->super_SQObject)._unVal.pTable,
     (pSVar1->super_SQDelegable)._delegate != (SQTable *)0x0)) {
    closure.super_SQObject._type = OT_NULL;
    closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
    iVar2 = (*(pSVar1->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [6])(pSVar1,this,8);
    if ((char)iVar2 != '\0') {
      Push(this,obj1);
      unaff_R12B = CallMetaMethod(this,&closure,mm,1,dest);
    }
    SQObjectPtr::~SQObjectPtr(&closure);
    if ((char)iVar2 != '\0') goto LAB_001587dd;
  }
  ss = this->_sharedstate;
  s = GetTypeName(obj1);
  x = SQString::Create(ss,s,-1);
  SQObjectPtr::operator=(dest,x);
  unaff_R12B = 1;
LAB_001587dd:
  return (bool)(unaff_R12B & 1);
}

Assistant:

bool SQVM::TypeOf(const SQObjectPtr &obj1,SQObjectPtr &dest)
{
    if(is_delegable(obj1) && _delegable(obj1)->_delegate) {
        SQObjectPtr closure;
        if(_delegable(obj1)->GetMetaMethod(this, MT_TYPEOF, closure)) {
            Push(obj1);
            return CallMetaMethod(closure,MT_TYPEOF,1,dest);
        }
    }
    dest = SQString::Create(_ss(this),GetTypeName(obj1));
    return true;
}